

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void just_test_test_case_f_test_throws_when_fails_to_open_file_for_read(void)

{
  size_t __nbytes;
  error *anon_var_0;
  string local_a0;
  assert_msg local_80;
  allocator<char> local_41;
  string local_40 [32];
  vector<char,_std::allocator<char>_> local_20;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/proc/asd",&local_41);
  just::file::read((int)&local_20,local_40,__nbytes);
  std::vector<char,_std::allocator<char>_>::~vector(&local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,(allocator<char> *)((long)&anon_var_0 + 7));
  just::test::assert_msg::assert_msg(&local_80,&local_a0,0x49);
  just::test::assert_msg::operator()(&local_80,false);
  just::test::assert_msg::~assert_msg(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  return;
}

Assistant:

JUST_TEST_CASE(test_throws_when_fails_to_open_file_for_read)
{
  try
  {
    just::file::read("/proc/asd");
    JUST_ASSERT(!"The above should have thrown");
  }
  catch (const just::file::error&)
  {
    // ignore
  }
}